

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesBase.cpp
# Opt level: O0

void __thiscall
vkt::sparse::SparseResourcesBaseInstance::createDeviceSupportingQueues
          (SparseResourcesBaseInstance *this,QueueRequirementsVec *queueRequirements)

{
  size_t *this_00;
  VkDevice device;
  PtrData<vk::DeviceDriver,_de::DefaultDeleter<vk::DeviceDriver>_> data;
  PtrData<vk::Allocator,_de::DefaultDeleter<vk::Allocator>_> data_00;
  RefData<vk::VkDevice_s_*> data_01;
  VkPhysicalDevice pVVar1;
  VkPhysicalDevice pVVar2;
  bool bVar3;
  uint uVar4;
  deUint32 dVar5;
  ResourceError *pRVar6;
  reference pvVar7;
  ulong uVar8;
  size_type sVar9;
  NotSupportedError *this_01;
  mapped_type *pmVar10;
  mapped_type *this_02;
  pointer ppVar11;
  mapped_type *pmVar12;
  DeviceDriver *pDVar13;
  VkDevice_s **ppVVar14;
  SimpleAllocator *this_03;
  pointer ppVar15;
  reference pvVar16;
  VkQueue pVVar17;
  Queue *queue_1;
  iterator iStack_500;
  deUint32 queueNdx_2;
  _Self local_4f8;
  iterator queuesIter;
  VkPhysicalDeviceMemoryProperties local_4e8;
  PtrData<vk::Allocator,_de::DefaultDeleter<vk::Allocator>_> local_2e0;
  PtrData<vk::Allocator,_de::DefaultDeleter<vk::Allocator>_> *local_2d0;
  DefaultDeleter<vk::DeviceDriver> local_2b9;
  PtrData<vk::DeviceDriver,_de::DefaultDeleter<vk::DeviceDriver>_> local_2b8;
  PtrData<vk::DeviceDriver,_de::DefaultDeleter<vk::DeviceDriver>_> *local_2a8;
  Move<vk::VkDevice_s_*> local_298;
  RefData<vk::VkDevice_s_*> local_280;
  undefined1 local_268 [8];
  VkDeviceCreateInfo deviceInfo;
  VkPhysicalDeviceFeatures deviceFeatures;
  VkDeviceQueueCreateInfo queueInfo;
  iterator iStack_110;
  deUint32 queueNdx_1;
  _Self local_108;
  iterator queueFamilyIter;
  vector<vk::VkDeviceQueueCreateInfo,_std::allocator<vk::VkDeviceQueueCreateInfo>_> queueInfos;
  Queue queue;
  deUint32 queueNdx;
  deUint32 queuesPerFamilyCount;
  deUint32 queuesFoundCount;
  deUint32 queueFamilyIndex;
  QueueRequirements *queueRequirement;
  undefined1 local_b8 [4];
  deUint32 queueReqNdx;
  QueuePrioritiesMap queuePriorities;
  SelectedQueuesMap selectedQueueFamilies;
  vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
  queueFamilyProperties;
  uint local_2c;
  VkPhysicalDevice pVStack_28;
  deUint32 queueFamilyPropertiesCount;
  VkPhysicalDevice physicalDevice;
  InstanceInterface *instance;
  QueueRequirementsVec *queueRequirements_local;
  SparseResourcesBaseInstance *this_local;
  
  instance = (InstanceInterface *)queueRequirements;
  queueRequirements_local = (QueueRequirementsVec *)this;
  physicalDevice =
       (VkPhysicalDevice)Context::getInstanceInterface((this->super_TestInstance).m_context);
  pVStack_28 = Context::getPhysicalDevice((this->super_TestInstance).m_context);
  local_2c = 0;
  (**(code **)(*(long *)physicalDevice + 0x30))(physicalDevice,pVStack_28,&local_2c,0);
  if (local_2c == 0) {
    pRVar6 = (ResourceError *)__cxa_allocate_exception(0x38);
    tcu::ResourceError::ResourceError
              (pRVar6,"Device reports an empty set of queue family properties",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesBase.cpp"
               ,0x4c);
    __cxa_throw(pRVar6,&tcu::ResourceError::typeinfo,tcu::ResourceError::~ResourceError);
  }
  this_00 = &selectedQueueFamilies._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>::vector
            ((vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_> *)
             this_00);
  std::vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>::resize
            ((vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_> *)
             this_00,(ulong)local_2c);
  pVVar2 = physicalDevice;
  pVVar1 = pVStack_28;
  pvVar7 = std::vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>::
           operator[]((vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                       *)&selectedQueueFamilies._M_t._M_impl.super__Rb_tree_header._M_node_count,0);
  (**(code **)(*(long *)pVVar2 + 0x30))(pVVar2,pVVar1,&local_2c,pvVar7);
  if (local_2c == 0) {
    pRVar6 = (ResourceError *)__cxa_allocate_exception(0x38);
    tcu::ResourceError::ResourceError
              (pRVar6,"Device reports an empty set of queue family properties",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesBase.cpp"
               ,0x54);
    __cxa_throw(pRVar6,&tcu::ResourceError::typeinfo,tcu::ResourceError::~ResourceError);
  }
  std::
  map<unsigned_int,_vkt::sparse::(anonymous_namespace)::QueueFamilyQueuesCount,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_vkt::sparse::(anonymous_namespace)::QueueFamilyQueuesCount>_>_>
  ::map((map<unsigned_int,_vkt::sparse::(anonymous_namespace)::QueueFamilyQueuesCount,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_vkt::sparse::(anonymous_namespace)::QueueFamilyQueuesCount>_>_>
         *)&queuePriorities._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  map<unsigned_int,_std::vector<float,_std::allocator<float>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>_>_>
  ::map((map<unsigned_int,_std::vector<float,_std::allocator<float>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>_>_>
         *)local_b8);
  queueRequirement._4_4_ = 0;
  do {
    uVar8 = (ulong)queueRequirement._4_4_;
    sVar9 = std::
            vector<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
            ::size((vector<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
                    *)instance);
    if (sVar9 <= uVar8) {
      std::vector<vk::VkDeviceQueueCreateInfo,_std::allocator<vk::VkDeviceQueueCreateInfo>_>::vector
                ((vector<vk::VkDeviceQueueCreateInfo,_std::allocator<vk::VkDeviceQueueCreateInfo>_>
                  *)&queueFamilyIter);
      local_108._M_node =
           (_Base_ptr)
           std::
           map<unsigned_int,_vkt::sparse::(anonymous_namespace)::QueueFamilyQueuesCount,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_vkt::sparse::(anonymous_namespace)::QueueFamilyQueuesCount>_>_>
           ::begin((map<unsigned_int,_vkt::sparse::(anonymous_namespace)::QueueFamilyQueuesCount,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_vkt::sparse::(anonymous_namespace)::QueueFamilyQueuesCount>_>_>
                    *)&queuePriorities._M_t._M_impl.super__Rb_tree_header._M_node_count);
      while( true ) {
        iStack_110 = std::
                     map<unsigned_int,_vkt::sparse::(anonymous_namespace)::QueueFamilyQueuesCount,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_vkt::sparse::(anonymous_namespace)::QueueFamilyQueuesCount>_>_>
                     ::end((map<unsigned_int,_vkt::sparse::(anonymous_namespace)::QueueFamilyQueuesCount,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_vkt::sparse::(anonymous_namespace)::QueueFamilyQueuesCount>_>_>
                            *)&queuePriorities._M_t._M_impl.super__Rb_tree_header._M_node_count);
        bVar3 = std::operator!=(&local_108,&stack0xfffffffffffffef0);
        if (!bVar3) break;
        queueInfo.pQueuePriorities._4_4_ = 0;
        while( true ) {
          uVar4 = queueInfo.pQueuePriorities._4_4_;
          ppVar11 = std::
                    _Rb_tree_iterator<std::pair<const_unsigned_int,_vkt::sparse::(anonymous_namespace)::QueueFamilyQueuesCount>_>
                    ::operator->(&local_108);
          if ((ppVar11->second).queueCount <= uVar4) break;
          ppVar11 = std::
                    _Rb_tree_iterator<std::pair<const_unsigned_int,_vkt::sparse::(anonymous_namespace)::QueueFamilyQueuesCount>_>
                    ::operator->(&local_108);
          pmVar12 = std::
                    map<unsigned_int,_std::vector<float,_std::allocator<float>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>_>_>
                    ::operator[]((map<unsigned_int,_std::vector<float,_std::allocator<float>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>_>_>
                                  *)local_b8,&ppVar11->first);
          queueInfo.pQueuePriorities._0_4_ = 0x3f800000;
          std::vector<float,_std::allocator<float>_>::push_back
                    (pmVar12,(value_type_conflict2 *)&queueInfo.pQueuePriorities);
          queueInfo.pQueuePriorities._4_4_ = queueInfo.pQueuePriorities._4_4_ + 1;
        }
        deviceFeatures.variableMultisampleRate = 2;
        queueInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
        queueInfo._4_4_ = 0;
        queueInfo.pNext._0_4_ = 0;
        ppVar11 = std::
                  _Rb_tree_iterator<std::pair<const_unsigned_int,_vkt::sparse::(anonymous_namespace)::QueueFamilyQueuesCount>_>
                  ::operator->(&local_108);
        queueInfo.pNext._4_4_ = ppVar11->first;
        ppVar11 = std::
                  _Rb_tree_iterator<std::pair<const_unsigned_int,_vkt::sparse::(anonymous_namespace)::QueueFamilyQueuesCount>_>
                  ::operator->(&local_108);
        queueInfo.flags = (ppVar11->second).queueCount;
        ppVar11 = std::
                  _Rb_tree_iterator<std::pair<const_unsigned_int,_vkt::sparse::(anonymous_namespace)::QueueFamilyQueuesCount>_>
                  ::operator->(&local_108);
        pmVar12 = std::
                  map<unsigned_int,_std::vector<float,_std::allocator<float>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>_>_>
                  ::operator[]((map<unsigned_int,_std::vector<float,_std::allocator<float>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>_>_>
                                *)local_b8,&ppVar11->first);
        queueInfo._24_8_ = std::vector<float,_std::allocator<float>_>::operator[](pmVar12,0);
        std::vector<vk::VkDeviceQueueCreateInfo,_std::allocator<vk::VkDeviceQueueCreateInfo>_>::
        push_back((vector<vk::VkDeviceQueueCreateInfo,_std::allocator<vk::VkDeviceQueueCreateInfo>_>
                   *)&queueFamilyIter,(value_type *)&deviceFeatures.variableMultisampleRate);
        std::
        _Rb_tree_iterator<std::pair<const_unsigned_int,_vkt::sparse::(anonymous_namespace)::QueueFamilyQueuesCount>_>
        ::operator++(&local_108);
      }
      ::vk::getPhysicalDeviceFeatures
                ((VkPhysicalDeviceFeatures *)((long)&deviceInfo.pEnabledFeatures + 4),
                 (InstanceInterface *)physicalDevice,pVStack_28);
      local_268._0_4_ = VK_STRUCTURE_TYPE_DEVICE_CREATE_INFO;
      deviceInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
      deviceInfo._4_4_ = 0;
      deviceInfo.pNext._0_4_ = 0;
      sVar9 = std::vector<vk::VkDeviceQueueCreateInfo,_std::allocator<vk::VkDeviceQueueCreateInfo>_>
              ::size((vector<vk::VkDeviceQueueCreateInfo,_std::allocator<vk::VkDeviceQueueCreateInfo>_>
                      *)&queueFamilyIter);
      deviceInfo.pNext._4_4_ = (undefined4)sVar9;
      deviceInfo._16_8_ =
           std::vector<vk::VkDeviceQueueCreateInfo,_std::allocator<vk::VkDeviceQueueCreateInfo>_>::
           operator[]((vector<vk::VkDeviceQueueCreateInfo,_std::allocator<vk::VkDeviceQueueCreateInfo>_>
                       *)&queueFamilyIter,0);
      deviceInfo.pQueueCreateInfos._0_4_ = 0;
      deviceInfo.enabledLayerCount = 0;
      deviceInfo._36_4_ = 0;
      deviceInfo.ppEnabledLayerNames._0_4_ = 0;
      deviceInfo.enabledExtensionCount = 0;
      deviceInfo._52_4_ = 0;
      deviceInfo.ppEnabledExtensionNames = (char **)((long)&deviceInfo.pEnabledFeatures + 4);
      ::vk::createDevice(&local_298,(InstanceInterface *)physicalDevice,pVStack_28,
                         (VkDeviceCreateInfo *)local_268,(VkAllocationCallbacks *)0x0);
      ::vk::refdetails::Move::operator_cast_to_RefData(&local_280,(Move *)&local_298);
      data_01.deleter.m_destroyDevice = local_280.deleter.m_destroyDevice;
      data_01.object = local_280.object;
      data_01.deleter.m_allocator = local_280.deleter.m_allocator;
      ::vk::refdetails::Move<vk::VkDevice_s_*>::operator=(&this->m_logicalDevice,data_01);
      ::vk::refdetails::Move<vk::VkDevice_s_*>::~Move(&local_298);
      pDVar13 = (DeviceDriver *)operator_new(0x4b8);
      pVVar1 = physicalDevice;
      ppVVar14 = ::vk::refdetails::RefBase<vk::VkDevice_s_*>::operator*
                           (&(this->m_logicalDevice).super_RefBase<vk::VkDevice_s_*>);
      ::vk::DeviceDriver::DeviceDriver(pDVar13,(InstanceInterface *)pVVar1,*ppVVar14);
      de::DefaultDeleter<vk::DeviceDriver>::DefaultDeleter(&local_2b9);
      de::details::MovePtr<vk::DeviceDriver,_de::DefaultDeleter<vk::DeviceDriver>_>::MovePtr
                ((MovePtr<vk::DeviceDriver,_de::DefaultDeleter<vk::DeviceDriver>_> *)&local_2b8);
      local_2a8 = de::details::MovePtr::operator_cast_to_PtrData(&local_2b8,(MovePtr *)pDVar13);
      data._8_8_ = local_280.deleter.m_destroyDevice;
      data.ptr = (DeviceDriver *)local_280.object;
      de::details::MovePtr<vk::DeviceDriver,_de::DefaultDeleter<vk::DeviceDriver>_>::operator=
                (&this->m_deviceDriver,data);
      de::details::MovePtr<vk::DeviceDriver,_de::DefaultDeleter<vk::DeviceDriver>_>::~MovePtr
                ((MovePtr<vk::DeviceDriver,_de::DefaultDeleter<vk::DeviceDriver>_> *)&local_2b8);
      this_03 = (SimpleAllocator *)operator_new(0x220);
      pDVar13 = de::details::UniqueBase<vk::DeviceDriver,_de::DefaultDeleter<vk::DeviceDriver>_>::
                operator*(&(this->m_deviceDriver).
                           super_UniqueBase<vk::DeviceDriver,_de::DefaultDeleter<vk::DeviceDriver>_>
                         );
      ppVVar14 = ::vk::refdetails::RefBase<vk::VkDevice_s_*>::operator*
                           (&(this->m_logicalDevice).super_RefBase<vk::VkDevice_s_*>);
      device = *ppVVar14;
      ::vk::getPhysicalDeviceMemoryProperties
                (&local_4e8,(InstanceInterface *)physicalDevice,pVStack_28);
      ::vk::SimpleAllocator::SimpleAllocator
                (this_03,&pDVar13->super_DeviceInterface,device,&local_4e8);
      de::DefaultDeleter<vk::Allocator>::DefaultDeleter
                ((DefaultDeleter<vk::Allocator> *)((long)&queuesIter._M_node + 7));
      de::details::MovePtr<vk::Allocator,_de::DefaultDeleter<vk::Allocator>_>::MovePtr
                ((MovePtr<vk::Allocator,_de::DefaultDeleter<vk::Allocator>_> *)&local_2e0);
      local_2d0 = de::details::MovePtr::operator_cast_to_PtrData(&local_2e0,(MovePtr *)this_03);
      data_00._8_8_ = local_280.deleter.m_destroyDevice;
      data_00.ptr = (Allocator *)local_280.object;
      de::details::MovePtr<vk::Allocator,_de::DefaultDeleter<vk::Allocator>_>::operator=
                (&this->m_allocator,data_00);
      de::details::MovePtr<vk::Allocator,_de::DefaultDeleter<vk::Allocator>_>::~MovePtr
                ((MovePtr<vk::Allocator,_de::DefaultDeleter<vk::Allocator>_> *)&local_2e0);
      local_4f8._M_node =
           (_Base_ptr)
           std::
           map<unsigned_int,_std::vector<vkt::sparse::Queue,_std::allocator<vkt::sparse::Queue>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<vkt::sparse::Queue,_std::allocator<vkt::sparse::Queue>_>_>_>_>
           ::begin(&this->m_queues);
      while( true ) {
        iStack_500 = std::
                     map<unsigned_int,_std::vector<vkt::sparse::Queue,_std::allocator<vkt::sparse::Queue>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<vkt::sparse::Queue,_std::allocator<vkt::sparse::Queue>_>_>_>_>
                     ::end(&this->m_queues);
        bVar3 = std::operator!=(&local_4f8,&stack0xfffffffffffffb00);
        if (!bVar3) break;
        queue_1._4_4_ = 0;
        while( true ) {
          ppVar15 = std::
                    _Rb_tree_iterator<std::pair<const_unsigned_int,_std::vector<vkt::sparse::Queue,_std::allocator<vkt::sparse::Queue>_>_>_>
                    ::operator->(&local_4f8);
          sVar9 = std::vector<vkt::sparse::Queue,_std::allocator<vkt::sparse::Queue>_>::size
                            (&ppVar15->second);
          if (sVar9 <= queue_1._4_4_) break;
          ppVar15 = std::
                    _Rb_tree_iterator<std::pair<const_unsigned_int,_std::vector<vkt::sparse::Queue,_std::allocator<vkt::sparse::Queue>_>_>_>
                    ::operator->(&local_4f8);
          pvVar16 = std::vector<vkt::sparse::Queue,_std::allocator<vkt::sparse::Queue>_>::operator[]
                              (&ppVar15->second,(ulong)queue_1._4_4_);
          pDVar13 = de::details::UniqueBase<vk::DeviceDriver,_de::DefaultDeleter<vk::DeviceDriver>_>
                    ::operator*(&(this->m_deviceDriver).
                                 super_UniqueBase<vk::DeviceDriver,_de::DefaultDeleter<vk::DeviceDriver>_>
                               );
          ppVVar14 = ::vk::refdetails::RefBase<vk::VkDevice_s_*>::operator*
                               (&(this->m_logicalDevice).super_RefBase<vk::VkDevice_s_*>);
          pVVar17 = ::vk::getDeviceQueue
                              (&pDVar13->super_DeviceInterface,*ppVVar14,pvVar16->queueFamilyIndex,
                               pvVar16->queueIndex);
          pvVar16->queueHandle = pVVar17;
          queue_1._4_4_ = queue_1._4_4_ + 1;
        }
        std::
        _Rb_tree_iterator<std::pair<const_unsigned_int,_std::vector<vkt::sparse::Queue,_std::allocator<vkt::sparse::Queue>_>_>_>
        ::operator++(&local_4f8);
      }
      std::vector<vk::VkDeviceQueueCreateInfo,_std::allocator<vk::VkDeviceQueueCreateInfo>_>::
      ~vector((vector<vk::VkDeviceQueueCreateInfo,_std::allocator<vk::VkDeviceQueueCreateInfo>_> *)
              &queueFamilyIter);
      std::
      map<unsigned_int,_std::vector<float,_std::allocator<float>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>_>_>
      ::~map((map<unsigned_int,_std::vector<float,_std::allocator<float>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>_>_>
              *)local_b8);
      std::
      map<unsigned_int,_vkt::sparse::(anonymous_namespace)::QueueFamilyQueuesCount,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_vkt::sparse::(anonymous_namespace)::QueueFamilyQueuesCount>_>_>
      ::~map((map<unsigned_int,_vkt::sparse::(anonymous_namespace)::QueueFamilyQueuesCount,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_vkt::sparse::(anonymous_namespace)::QueueFamilyQueuesCount>_>_>
              *)&queuePriorities._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>::
      ~vector((vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_> *)
              &selectedQueueFamilies._M_t._M_impl.super__Rb_tree_header._M_node_count);
      return;
    }
    _queuesFoundCount =
         std::
         vector<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>::
         operator[]((vector<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
                     *)instance,(ulong)queueRequirement._4_4_);
    queuesPerFamilyCount = 0;
    queueNdx = 0;
    do {
      queuesPerFamilyCount =
           sparse::anon_unknown_0::findMatchingQueueFamilyIndex
                     ((vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                       *)&selectedQueueFamilies._M_t._M_impl.super__Rb_tree_header._M_node_count,
                      _queuesFoundCount->queueFlags,queuesPerFamilyCount);
      if (queuesPerFamilyCount == 0xffffffff) {
        this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        tcu::NotSupportedError::NotSupportedError
                  (this_01,"No match found for queue requirements",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesBase.cpp"
                   ,0x65);
        __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,
                    tcu::NotSupportedError::~NotSupportedError);
      }
      pvVar7 = std::
               vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>::
               operator[]((vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                           *)&selectedQueueFamilies._M_t._M_impl.super__Rb_tree_header._M_node_count
                          ,(ulong)queuesPerFamilyCount);
      uVar4 = deMin32(pvVar7->queueCount,_queuesFoundCount->queueCount - queueNdx);
      pmVar10 = std::
                map<unsigned_int,_vkt::sparse::(anonymous_namespace)::QueueFamilyQueuesCount,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_vkt::sparse::(anonymous_namespace)::QueueFamilyQueuesCount>_>_>
                ::operator[]((map<unsigned_int,_vkt::sparse::(anonymous_namespace)::QueueFamilyQueuesCount,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_vkt::sparse::(anonymous_namespace)::QueueFamilyQueuesCount>_>_>
                              *)&queuePriorities._M_t._M_impl.super__Rb_tree_header._M_node_count,
                             &queuesPerFamilyCount);
      dVar5 = deMax32(uVar4,pmVar10->queueCount);
      pmVar10 = std::
                map<unsigned_int,_vkt::sparse::(anonymous_namespace)::QueueFamilyQueuesCount,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_vkt::sparse::(anonymous_namespace)::QueueFamilyQueuesCount>_>_>
                ::operator[]((map<unsigned_int,_vkt::sparse::(anonymous_namespace)::QueueFamilyQueuesCount,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_vkt::sparse::(anonymous_namespace)::QueueFamilyQueuesCount>_>_>
                              *)&queuePriorities._M_t._M_impl.super__Rb_tree_header._M_node_count,
                             &queuesPerFamilyCount);
      pmVar10->queueCount = dVar5;
      for (queue.queueFamilyIndex = 0; queue.queueFamilyIndex < uVar4;
          queue.queueFamilyIndex = queue.queueFamilyIndex + 1) {
        this_02 = std::
                  map<unsigned_int,_std::vector<vkt::sparse::Queue,_std::allocator<vkt::sparse::Queue>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<vkt::sparse::Queue,_std::allocator<vkt::sparse::Queue>_>_>_>_>
                  ::operator[](&this->m_queues,&_queuesFoundCount->queueFlags);
        std::vector<vkt::sparse::Queue,_std::allocator<vkt::sparse::Queue>_>::push_back
                  (this_02,(value_type *)
                           &queueInfos.
                            super__Vector_base<vk::VkDeviceQueueCreateInfo,_std::allocator<vk::VkDeviceQueueCreateInfo>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      queueNdx = uVar4 + queueNdx;
      queuesPerFamilyCount = queuesPerFamilyCount + 1;
    } while (queueNdx < _queuesFoundCount->queueCount);
    queueRequirement._4_4_ = queueRequirement._4_4_ + 1;
  } while( true );
}

Assistant:

void SparseResourcesBaseInstance::createDeviceSupportingQueues(const QueueRequirementsVec& queueRequirements)
{
	typedef std::map<vk::VkQueueFlags, std::vector<Queue> >		QueuesMap;
	typedef std::map<deUint32, QueueFamilyQueuesCount>			SelectedQueuesMap;
	typedef std::map<deUint32, std::vector<float> >				QueuePrioritiesMap;

	const InstanceInterface&	instance		= m_context.getInstanceInterface();
	const VkPhysicalDevice		physicalDevice	= m_context.getPhysicalDevice();

	deUint32 queueFamilyPropertiesCount = 0u;
	instance.getPhysicalDeviceQueueFamilyProperties(physicalDevice, &queueFamilyPropertiesCount, DE_NULL);

	if(queueFamilyPropertiesCount == 0u)
		TCU_THROW(ResourceError, "Device reports an empty set of queue family properties");

	std::vector<VkQueueFamilyProperties> queueFamilyProperties;
	queueFamilyProperties.resize(queueFamilyPropertiesCount);

	instance.getPhysicalDeviceQueueFamilyProperties(physicalDevice, &queueFamilyPropertiesCount, &queueFamilyProperties[0]);

	if (queueFamilyPropertiesCount == 0u)
		TCU_THROW(ResourceError, "Device reports an empty set of queue family properties");

	SelectedQueuesMap	selectedQueueFamilies;
	QueuePrioritiesMap	queuePriorities;

	for (deUint32 queueReqNdx = 0; queueReqNdx < queueRequirements.size(); ++queueReqNdx)
	{
		const QueueRequirements& queueRequirement = queueRequirements[queueReqNdx];

		deUint32 queueFamilyIndex	= 0u;
		deUint32 queuesFoundCount	= 0u;

		do
		{
			queueFamilyIndex = findMatchingQueueFamilyIndex(queueFamilyProperties, queueRequirement.queueFlags, queueFamilyIndex);

			if (queueFamilyIndex == NO_MATCH_FOUND)
				TCU_THROW(NotSupportedError, "No match found for queue requirements");

			const deUint32 queuesPerFamilyCount = deMin32(queueFamilyProperties[queueFamilyIndex].queueCount, queueRequirement.queueCount - queuesFoundCount);

			selectedQueueFamilies[queueFamilyIndex].queueCount = deMax32(queuesPerFamilyCount, selectedQueueFamilies[queueFamilyIndex].queueCount);

			for (deUint32 queueNdx = 0; queueNdx < queuesPerFamilyCount; ++queueNdx)
			{
				Queue queue;
				queue.queueFamilyIndex	= queueFamilyIndex;
				queue.queueIndex		= queueNdx;

				m_queues[queueRequirement.queueFlags].push_back(queue);
			}

			queuesFoundCount += queuesPerFamilyCount;

			++queueFamilyIndex;
		} while (queuesFoundCount < queueRequirement.queueCount);
	}

	std::vector<VkDeviceQueueCreateInfo> queueInfos;

	for (SelectedQueuesMap::iterator queueFamilyIter = selectedQueueFamilies.begin(); queueFamilyIter != selectedQueueFamilies.end(); ++queueFamilyIter)
	{
		for (deUint32 queueNdx = 0; queueNdx < queueFamilyIter->second.queueCount; ++queueNdx)
			queuePriorities[queueFamilyIter->first].push_back(1.0f);

		const VkDeviceQueueCreateInfo queueInfo =
		{
			VK_STRUCTURE_TYPE_DEVICE_QUEUE_CREATE_INFO,		// VkStructureType             sType;
			DE_NULL,										// const void*                 pNext;
			(VkDeviceQueueCreateFlags)0u,					// VkDeviceQueueCreateFlags    flags;
			queueFamilyIter->first,							// uint32_t                    queueFamilyIndex;
			queueFamilyIter->second.queueCount,				// uint32_t                    queueCount;
			&queuePriorities[queueFamilyIter->first][0],	// const float*                pQueuePriorities;
		};

		queueInfos.push_back(queueInfo);
	}

	const VkPhysicalDeviceFeatures	deviceFeatures	= getPhysicalDeviceFeatures(instance, physicalDevice);
	const VkDeviceCreateInfo		deviceInfo		=
	{
		VK_STRUCTURE_TYPE_DEVICE_CREATE_INFO,		// VkStructureType                    sType;
		DE_NULL,									// const void*                        pNext;
		(VkDeviceCreateFlags)0,						// VkDeviceCreateFlags                flags;
		static_cast<deUint32>(queueInfos.size()),	// uint32_t                           queueCreateInfoCount;
		&queueInfos[0],								// const VkDeviceQueueCreateInfo*     pQueueCreateInfos;
		0u,											// uint32_t                           enabledLayerCount;
		DE_NULL,									// const char* const*                 ppEnabledLayerNames;
		0u,											// uint32_t                           enabledExtensionCount;
		DE_NULL,									// const char* const*                 ppEnabledExtensionNames;
		&deviceFeatures,							// const VkPhysicalDeviceFeatures*    pEnabledFeatures;
	};

	m_logicalDevice = createDevice(instance, physicalDevice, &deviceInfo);
	m_deviceDriver	= de::MovePtr<DeviceDriver>(new DeviceDriver(instance, *m_logicalDevice));
	m_allocator		= de::MovePtr<Allocator>(new SimpleAllocator(*m_deviceDriver, *m_logicalDevice, getPhysicalDeviceMemoryProperties(instance, physicalDevice)));

	for (QueuesMap::iterator queuesIter = m_queues.begin(); queuesIter != m_queues.end(); ++queuesIter)
	{
		for (deUint32 queueNdx = 0u; queueNdx < queuesIter->second.size(); ++queueNdx)
		{
			Queue& queue = queuesIter->second[queueNdx];

			queue.queueHandle = getDeviceQueue(*m_deviceDriver, *m_logicalDevice, queue.queueFamilyIndex, queue.queueIndex);
		}
	}
}